

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O0

void event_signal_missile(game_event_type type,object *obj,_Bool seen,wchar_t y,wchar_t x)

{
  undefined1 local_58 [8];
  game_event_data data;
  wchar_t local_20;
  wchar_t x_local;
  wchar_t y_local;
  _Bool seen_local;
  object *obj_local;
  game_event_type type_local;
  
  local_58 = (undefined1  [8])obj;
  data.flag = seen;
  data.point.y = y;
  data.message.type = x;
  data.explosion.centre.y = x;
  local_20 = y;
  x_local._3_1_ = seen;
  _y_local = obj;
  obj_local._4_4_ = type;
  game_event_dispatch(type,(game_event_data *)local_58);
  return;
}

Assistant:

void event_signal_missile(game_event_type type,
						  struct object *obj,
						  bool seen,
						  int y,
						  int x)
{
	game_event_data data;
	data.missile.obj = obj;
	data.missile.seen = seen;
	data.missile.y = y;
	data.missile.x = x;

	game_event_dispatch(type, &data);
}